

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_graph.h
# Opt level: O3

vector<filtered_directed_graph_t,_std::allocator<filtered_directed_graph_t>_> * __thiscall
filtered_directed_graph_t::get_connected_subgraphs
          (vector<filtered_directed_graph_t,_std::allocator<filtered_directed_graph_t>_>
           *__return_storage_ptr__,filtered_directed_graph_t *this,
          vertex_index_t minimal_number_of_vertices)

{
  _Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *__ht;
  ushort uVar1;
  pointer puVar2;
  _Hash_node_base *p_Var3;
  __hashtable *__h;
  ostream *poVar4;
  uint uVar5;
  ulong uVar6;
  char *__to;
  __node_base _Var7;
  uint uVar8;
  char *__from;
  ushort uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  vector<filtered_directed_graph_t,_std::allocator<filtered_directed_graph_t>_> *subgraphs;
  vertex_index_t component;
  pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>
  pair;
  unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
  vertex_set;
  vector<float,_std::allocator<float>_> weights;
  filtered_union_find dset;
  unordered_map<unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>_>_>
  connected_components;
  _AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_short,_false>_>_> local_260;
  undefined1 local_258 [16];
  __node_base local_248;
  size_type sStack_240;
  _Hash_node_base *local_238;
  _Hash_node_base *local_230;
  __node_base_ptr p_Stack_228;
  undefined8 local_220;
  _Hash_node_base *local_218;
  undefined1 local_210 [40];
  __node_base_ptr p_Stack_1e8;
  __node_base_ptr local_1e0;
  vector<float,_std::allocator<float>_> local_1d8;
  filtered_union_find local_1c0;
  undefined1 local_178 [40];
  __node_base_ptr p_Stack_150;
  __node_base_ptr local_148;
  _Hashtable<unsigned_short,_std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_140;
  undefined1 local_108 [24];
  pointer local_f0;
  pointer local_e8;
  pointer local_d8;
  pointer local_d0;
  pointer local_c0;
  pointer local_b8;
  pointer local_a8;
  pointer local_98;
  pointer local_88;
  pointer local_80;
  pointer local_70;
  pointer local_60;
  pointer local_50;
  pointer local_48;
  pointer local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"computing connected subgraphs",0x1d);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\r",1);
  local_108._0_8_ = (ulong)(uint)local_108._4_4_ << 0x20;
  std::vector<float,_std::allocator<float>_>::vector
            (&local_1d8,(ulong)(this->super_directed_graph_t).number_of_vertices,
             (value_type_conflict2 *)local_108,(allocator_type *)&local_1c0);
  filtered_union_find::filtered_union_find(&local_1c0,&local_1d8);
  uVar12 = (long)(this->super_directed_graph_t).edges.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->super_directed_graph_t).edges.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start >> 1;
  if (1 < uVar12) {
    uVar11 = 0;
    do {
      puVar2 = (this->super_directed_graph_t).edges.
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = puVar2[uVar11 * 2];
      uVar6 = (ulong)uVar9;
      uVar10 = local_1c0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar6];
      __from = (char *)(ulong)(uint)uVar9;
      uVar8 = uVar10;
      if (uVar10 != uVar9) {
        do {
          __from = (char *)(ulong)uVar8;
          bVar13 = local_1c0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar8] != uVar8;
          uVar8 = local_1c0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)uVar8];
        } while (bVar13);
      }
      for (; uVar8 = (uint)__from, uVar8 != uVar10;
          uVar10 = local_1c0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar10]) {
        local_1c0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[(int)uVar6] = uVar8;
        uVar6 = (ulong)uVar10;
      }
      uVar9 = puVar2[uVar11 * 2 + 1];
      uVar6 = (ulong)uVar9;
      uVar10 = local_1c0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar6];
      __to = (char *)(ulong)(uint)uVar9;
      uVar5 = uVar10;
      if (uVar10 != uVar9) {
        do {
          __to = (char *)(ulong)uVar5;
          bVar13 = local_1c0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar5] != uVar5;
          uVar5 = local_1c0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)uVar5];
        } while (bVar13);
      }
      for (; uVar5 = (uint)__to, uVar5 != uVar10;
          uVar10 = local_1c0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar10]) {
        local_1c0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[(int)uVar6] = uVar5;
        uVar6 = (ulong)uVar10;
      }
      if (uVar8 != uVar5) {
        filtered_union_find::link(&local_1c0,__from,__to);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar12 >> 1);
  }
  (__return_storage_ptr__->
  super__Vector_base<filtered_directed_graph_t,_std::allocator<filtered_directed_graph_t>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<filtered_directed_graph_t,_std::allocator<filtered_directed_graph_t>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<filtered_directed_graph_t,_std::allocator<filtered_directed_graph_t>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_140._M_buckets = &local_140._M_single_bucket;
  local_140._M_bucket_count = 1;
  local_140._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_140._M_element_count = 0;
  local_140._M_rehash_policy._M_max_load_factor = 1.0;
  local_140._M_rehash_policy._M_next_resize = 0;
  local_140._M_single_bucket = (__node_base_ptr)0x0;
  local_210._0_8_ = local_210._0_8_ & 0xffffffffffff0000;
  if ((this->super_directed_graph_t).number_of_vertices != 0) {
    uVar9 = 0;
    do {
      uVar12 = (ulong)uVar9;
      uVar10 = local_1c0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar12];
      uVar5 = (uint)uVar9;
      uVar8 = uVar10;
      if (uVar10 != uVar5) {
        do {
          uVar5 = uVar8;
          uVar8 = local_1c0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)uVar5];
        } while (local_1c0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)uVar5] != uVar5);
      }
      for (; uVar5 != uVar10;
          uVar10 = local_1c0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar10]) {
        local_1c0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[(int)uVar12] = uVar5;
        uVar12 = (ulong)uVar10;
      }
      uVar9 = (ushort)uVar5;
      local_260._M_h._0_2_ = uVar9;
      uVar12 = (ulong)(uVar5 & 0xffff) % local_140._M_bucket_count;
      if (local_140._M_buckets[uVar12 & 0xffffffff] != (__node_base_ptr)0x0) {
        p_Var3 = local_140._M_buckets[uVar12 & 0xffffffff]->_M_nxt;
        uVar1 = *(ushort *)&p_Var3[1]._M_nxt;
        do {
          if (uVar1 == uVar9) goto LAB_0011156b;
          p_Var3 = p_Var3->_M_nxt;
        } while ((p_Var3 != (_Hash_node_base *)0x0) &&
                (uVar1 = *(ushort *)&p_Var3[1]._M_nxt,
                (ulong)uVar1 % local_140._M_bucket_count == uVar12));
      }
      local_258._8_8_ = 1;
      local_248._M_nxt = (_Hash_node_base *)0x0;
      sStack_240 = 0;
      local_238 = (_Hash_node_base *)0x3f800000;
      local_230 = (_Hash_node_base *)0x0;
      p_Stack_228 = (__node_base_ptr)0x0;
      local_108._0_2_ = uVar9;
      local_258._0_8_ = &p_Stack_228;
      std::
      _Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_Hashtable((_Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)(local_108 + 8),
                   (_Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)local_258,
                   (_Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)local_258);
      std::
      _Hashtable<unsigned_short,std::pair<unsigned_short_const,std::unordered_set<unsigned_short,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<unsigned_short>>>,std::allocator<std::pair<unsigned_short_const,std::unordered_set<unsigned_short,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<unsigned_short>>>>,std::__detail::_Select1st,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<std::pair<unsigned_short,std::unordered_set<unsigned_short,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<unsigned_short>>>>
                ((_Hashtable<unsigned_short,std::pair<unsigned_short_const,std::unordered_set<unsigned_short,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<unsigned_short>>>,std::allocator<std::pair<unsigned_short_const,std::unordered_set<unsigned_short,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<unsigned_short>>>>,std::__detail::_Select1st,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&local_140,local_108);
      std::
      _Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)(local_108 + 8));
      std::
      _Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)local_258);
LAB_0011156b:
      local_108._0_8_ =
           std::__detail::
           _Map_base<unsigned_short,_std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&local_140,(key_type *)&local_260);
      std::
      _Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_short_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_short,false>>>>
                ((_Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_108._0_8_,
                 (_Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)local_210,local_108);
      uVar9 = local_210._0_2_ + 1;
      local_210._0_2_ = uVar9;
    } while (uVar9 < (this->super_directed_graph_t).number_of_vertices);
    if (local_140._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      local_218 = (_Hash_node_base *)(ulong)minimal_number_of_vertices;
      _Var7._M_nxt = local_140._M_before_begin._M_nxt;
      do {
        local_258._0_2_ = *(undefined2 *)&_Var7._M_nxt[1]._M_nxt;
        __ht = (_Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)(local_258 + 8);
        local_258._8_8_ = 0;
        local_248._M_nxt = _Var7._M_nxt[3]._M_nxt;
        sStack_240 = 0;
        local_238 = _Var7._M_nxt[5]._M_nxt;
        local_230 = _Var7._M_nxt[6]._M_nxt;
        p_Stack_228 = _Var7._M_nxt[7]._M_nxt;
        local_220 = 0;
        local_108._0_8_ = __ht;
        std::
        _Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_assign<std::_Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_short,false>>>>
                  ((_Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)__ht,(_Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)(_Var7._M_nxt + 2),
                   (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_short,_false>_>_> *
                   )local_108);
        local_210._0_8_ = (__buckets_ptr)0x0;
        local_210._8_8_ = local_248._M_nxt;
        local_210._16_8_ = (_Hash_node_base *)0x0;
        local_210._24_8_ = local_238;
        local_210._32_8_ = local_230;
        p_Stack_1e8 = p_Stack_228;
        local_1e0 = (__node_base_ptr)0x0;
        local_108._0_8_ =
             (_Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)local_210;
        std::
        _Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_assign<std::_Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_short,false>>>>
                  ((_Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_210,__ht,
                   (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_short,_false>_>_> *
                   )local_108);
        if (local_218 <= (ulong)local_210._24_8_) {
          local_178._0_8_ = (__buckets_ptr)0x0;
          local_178._8_8_ = local_210._8_8_;
          local_178._16_8_ = (_Hash_node_base *)0x0;
          local_178._24_8_ = local_210._24_8_;
          local_178._32_8_ = local_210._32_8_;
          p_Stack_150 = p_Stack_1e8;
          local_148 = (__node_base_ptr)0x0;
          local_260._M_h = (__hashtable_alloc *)local_178;
          std::
          _Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_assign<std::_Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_short,false>>>>
                    ((_Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_178,
                     (_Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)local_210,&local_260);
          filtered_directed_graph_t
                    ((filtered_directed_graph_t *)local_108,this,
                     (unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
                      *)local_178);
          std::vector<filtered_directed_graph_t,_std::allocator<filtered_directed_graph_t>_>::
          emplace_back<filtered_directed_graph_t>
                    (__return_storage_ptr__,(filtered_directed_graph_t *)local_108);
          if (local_48 != (pointer)0x0) {
            operator_delete(local_48,(long)local_38 - (long)local_48);
          }
          if (local_60 != (pointer)0x0) {
            operator_delete(local_60,(long)local_50 - (long)local_60);
          }
          if (local_80 != (pointer)0x0) {
            operator_delete(local_80,(long)local_70 - (long)local_80);
          }
          if (local_98 != (pointer)0x0) {
            operator_delete(local_98,(long)local_88 - (long)local_98);
          }
          if (local_b8 != (pointer)0x0) {
            operator_delete(local_b8,(long)local_a8 - (long)local_b8);
          }
          if (local_d0 != (pointer)0x0) {
            operator_delete(local_d0,(long)local_c0 - (long)local_d0);
          }
          if (local_e8 != (pointer)0x0) {
            operator_delete(local_e8,(long)local_d8 - (long)local_e8);
          }
          if ((pointer)local_108._8_8_ != (pointer)0x0) {
            operator_delete((void *)local_108._8_8_,(long)local_f0 - local_108._8_8_);
          }
          std::
          _Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)local_178);
        }
        std::
        _Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_210);
        std::
        _Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)(local_258 + 8));
        _Var7._M_nxt = (_Var7._M_nxt)->_M_nxt;
      } while (_Var7._M_nxt != (_Hash_node_base *)0x0);
    }
  }
  std::
  _Hashtable<unsigned_short,_std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_140);
  if (local_1c0.filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c0.filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c0.filtration.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c0.filtration.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1c0.rank.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c0.rank.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c0.rank.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c0.rank.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1c0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_1c0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<filtered_directed_graph_t> get_connected_subgraphs(vertex_index_t minimal_number_of_vertices) {
#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "computing connected subgraphs" << std::flush << "\r";
#endif
		std::vector<value_t> weights(number_of_vertices, 0);
		filtered_union_find dset(weights);
		const auto number_of_edges = edge_number();

		for (size_t index = 0; index < number_of_edges; index++) {
			index_t u = dset.find(edges[2 * index]), v = dset.find(edges[2 * index + 1]);

			if (u != v) dset.link(u, v);
		}

		std::vector<filtered_directed_graph_t> subgraphs;
		{
			std::unordered_map<vertex_index_t, std::unordered_set<vertex_index_t>> connected_components;
			for (vertex_index_t index = 0; index < number_of_vertices; ++index) {
				vertex_index_t component = dset.find(index);
				if (connected_components.find(component) == connected_components.end()) {
					connected_components.insert(std::make_pair(component, std::unordered_set<vertex_index_t>()));
				}

				connected_components[component].insert(index);
			}

			for (auto pair : connected_components) {
				auto vertex_set = pair.second;
				if (vertex_set.size() < minimal_number_of_vertices) continue;
				subgraphs.push_back(filtered_directed_graph_t(this, vertex_set));
			}
		}

		return subgraphs;
	}